

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O0

void __thiscall Manifold_Invalid_Test::TestBody(Manifold_Invalid_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_388;
  Message local_380;
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  local_378;
  vector local_360 [20];
  Error local_34c;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_7;
  Message local_330;
  double local_328;
  vec<double,_2> local_320;
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  local_310;
  Manifold local_2f8 [20];
  Error local_2e4;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_6;
  Message local_2c8;
  double local_2c0;
  vec<double,_2> local_2b8;
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  local_2a8;
  Manifold local_290 [20];
  Error local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_5;
  Message local_260;
  double local_258;
  double local_250;
  double local_248;
  vec<double,_3> local_240;
  Manifold local_228 [20];
  Error local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_4;
  Message local_1f8;
  double local_1f0;
  vec<double,_3> local_1e8;
  Manifold local_1d0 [20];
  Error local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_3;
  Message local_1a0;
  Manifold local_198 [20];
  Error local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_2;
  Message local_168;
  Manifold local_160 [20];
  Error local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_1;
  Message local_130;
  Manifold local_128 [20];
  Error local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  vec<double,_2> local_f8;
  CrossSection local_e8 [8];
  CrossSection empty_sq;
  CrossSection local_98 [8];
  CrossSection empty_circ;
  CrossSection local_58 [8];
  CrossSection circ;
  Error local_14;
  Manifold_Invalid_Test *pMStack_10;
  Error invalid;
  Manifold_Invalid_Test *this_local;
  
  local_14 = InvalidConstruction;
  pMStack_10 = this;
  manifold::CrossSection::Circle(10.0,(int)local_58);
  manifold::CrossSection::Circle(-2.0,(int)local_98);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  linalg::vec<double,_2>::vec(&local_f8,(double *)&gtest_ar.message_);
  manifold::CrossSection::Square(local_f8.x._0_4_,local_f8.y,local_e8,0);
  manifold::Manifold::Sphere(0.0,(int)local_128);
  local_114 = manifold::Manifold::Status();
  testing::internal::EqHelper::
  Compare<manifold::Manifold::Error,_manifold::Manifold::Error,_nullptr>
            ((EqHelper *)local_110,"Manifold::Sphere(0).Status()","invalid",&local_114,&local_14);
  manifold::Manifold::~Manifold(local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x30d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  manifold::Manifold::Cylinder(0.0,5.0,-1.0,(int)local_160,false);
  local_14c = manifold::Manifold::Status();
  testing::internal::EqHelper::
  Compare<manifold::Manifold::Error,_manifold::Manifold::Error,_nullptr>
            ((EqHelper *)local_148,"Manifold::Cylinder(0, 5).Status()","invalid",&local_14c,
             &local_14);
  manifold::Manifold::~Manifold(local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x30e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  manifold::Manifold::Cylinder(2.0,-5.0,-1.0,(int)local_198,false);
  local_184 = manifold::Manifold::Status();
  testing::internal::EqHelper::
  Compare<manifold::Manifold::Error,_manifold::Manifold::Error,_nullptr>
            ((EqHelper *)local_180,"Manifold::Cylinder(2, -5).Status()","invalid",&local_184,
             &local_14);
  manifold::Manifold::~Manifold(local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x30f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1f0 = 0.0;
  linalg::vec<double,_3>::vec(&local_1e8,&local_1f0);
  manifold::Manifold::Cube(local_1d0,0);
  local_1bc = manifold::Manifold::Status();
  testing::internal::EqHelper::
  Compare<manifold::Manifold::Error,_manifold::Manifold::Error,_nullptr>
            ((EqHelper *)local_1b8,"Manifold::Cube(vec3(0.0)).Status()","invalid",&local_1bc,
             &local_14);
  manifold::Manifold::~Manifold(local_1d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x310,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  local_248 = -1.0;
  local_250 = 1.0;
  local_258 = 1.0;
  linalg::vec<double,_3>::vec(&local_240,&local_248,&local_250,&local_258);
  manifold::Manifold::Cube(local_228,0);
  local_214 = manifold::Manifold::Status();
  testing::internal::EqHelper::
  Compare<manifold::Manifold::Error,_manifold::Manifold::Error,_nullptr>
            ((EqHelper *)local_210,"Manifold::Cube({-1, 1, 1}).Status()","invalid",&local_214,
             &local_14);
  manifold::Manifold::~Manifold(local_228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x311,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  manifold::CrossSection::ToPolygons();
  local_2c0 = 1.0;
  linalg::vec<double,_2>::vec(&local_2b8,&local_2c0);
  manifold::Manifold::Extrude(0,0,local_2b8.x,local_2b8.y,local_290,&local_2a8,0);
  local_27c = manifold::Manifold::Status();
  testing::internal::EqHelper::
  Compare<manifold::Manifold::Error,_manifold::Manifold::Error,_nullptr>
            ((EqHelper *)local_278,"Manifold::Extrude(circ.ToPolygons(), 0.).Status()","invalid",
             &local_27c,&local_14);
  manifold::Manifold::~Manifold(local_290);
  std::
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ::~vector(&local_2a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x312,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  manifold::CrossSection::ToPolygons();
  local_328 = 1.0;
  linalg::vec<double,_2>::vec(&local_320,&local_328);
  manifold::Manifold::Extrude(0,0,local_320.x,local_320.y,local_2f8,&local_310,0);
  local_2e4 = manifold::Manifold::Status();
  testing::internal::EqHelper::
  Compare<manifold::Manifold::Error,_manifold::Manifold::Error,_nullptr>
            ((EqHelper *)local_2e0,"Manifold::Extrude(empty_circ.ToPolygons(), 10.).Status()",
             "invalid",&local_2e4,&local_14);
  manifold::Manifold::~Manifold(local_2f8);
  std::
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ::~vector(&local_310);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar1) {
    testing::Message::Message(&local_330);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x313,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  manifold::CrossSection::ToPolygons();
  manifold::Manifold::Revolve(local_360,(int)&local_378,360.0);
  local_34c = manifold::Manifold::Status();
  testing::internal::EqHelper::
  Compare<manifold::Manifold::Error,_manifold::Manifold::Error,_nullptr>
            ((EqHelper *)local_348,"Manifold::Revolve(empty_sq.ToPolygons()).Status()","invalid",
             &local_34c,&local_14);
  manifold::Manifold::~Manifold((Manifold *)local_360);
  std::
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ::~vector(&local_378);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x314,pcVar2);
    testing::internal::AssertHelper::operator=(&local_388,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  manifold::CrossSection::~CrossSection(local_e8);
  manifold::CrossSection::~CrossSection(local_98);
  manifold::CrossSection::~CrossSection(local_58);
  return;
}

Assistant:

TEST(Manifold, Invalid) {
  auto invalid = Manifold::Error::InvalidConstruction;
  auto circ = CrossSection::Circle(10.);
  auto empty_circ = CrossSection::Circle(-2.);
  auto empty_sq = CrossSection::Square(vec2(0.0));

  EXPECT_EQ(Manifold::Sphere(0).Status(), invalid);
  EXPECT_EQ(Manifold::Cylinder(0, 5).Status(), invalid);
  EXPECT_EQ(Manifold::Cylinder(2, -5).Status(), invalid);
  EXPECT_EQ(Manifold::Cube(vec3(0.0)).Status(), invalid);
  EXPECT_EQ(Manifold::Cube({-1, 1, 1}).Status(), invalid);
  EXPECT_EQ(Manifold::Extrude(circ.ToPolygons(), 0.).Status(), invalid);
  EXPECT_EQ(Manifold::Extrude(empty_circ.ToPolygons(), 10.).Status(), invalid);
  EXPECT_EQ(Manifold::Revolve(empty_sq.ToPolygons()).Status(), invalid);
}